

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O0

bool __thiscall HighsCutGeneration::determineCover(HighsCutGeneration *this,bool lpSol)

{
  anon_class_16_2_fd512ddf comp;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin;
  anon_class_24_3_1824b316 comp_00;
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  size_type sVar4;
  difference_type dVar5;
  reference pvVar6;
  pointer pHVar7;
  double *pdVar8;
  byte in_SIL;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RDI;
  HighsCDouble *pHVar9;
  double dVar10;
  HighsCDouble HVar11;
  HighsInt j_2;
  double lambda;
  double minlambda;
  HighsNodeQueue *nodequeue;
  HighsInt j_1;
  HighsInt i;
  HighsInt r;
  HighsInt coversize;
  HighsInt maxCoverSize;
  HighsInt j;
  HighsCDouble *in_stack_fffffffffffffea8;
  HighsCDouble *in_stack_fffffffffffffeb0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_fffffffffffffeb8;
  HighsCDouble *in_stack_fffffffffffffec0;
  anon_class_8_1_8991fb9c in_stack_fffffffffffffec8;
  pointer __new_size;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffed0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var12;
  undefined1 in_stack_fffffffffffffee0 [16];
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  double local_108;
  double in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  HighsInt *in_stack_ffffffffffffff10;
  double local_e8;
  double local_e0;
  HighsCDouble *local_d0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *local_c8;
  int *local_c0;
  int *local_b8;
  int *local_b0;
  int *local_a8;
  HighsCDouble *local_a0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *local_90;
  int *local_88;
  int *local_80;
  int *local_78;
  int *local_70;
  int local_68;
  int local_64;
  int *local_60;
  int *local_50;
  int *local_48;
  int *local_40;
  HighsCDouble local_38;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_24;
  int local_1c;
  int local_18;
  byte local_11;
  bool local_1;
  
  local_11 = in_SIL & 1;
  bVar1 = HighsCDouble::operator<=(in_stack_fffffffffffffeb0,(double)in_stack_fffffffffffffea8);
  if (bVar1) {
    local_1 = false;
  }
  else {
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x58a7f8);
    std::vector<int,_std::allocator<int>_>::reserve
              (in_stack_fffffffffffffee0._0_8_,(size_type)in_RDI._M_current);
    for (local_18 = 0;
        local_18 != *(int *)((long)&((HighsCDouble *)((long)in_RDI._M_current + 0xe0))->hi + 4);
        local_18 = local_18 + 1) {
      pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &((HighsCDouble *)((long)in_RDI._M_current + 0x90))->lo,(long)local_18);
      if ((*pvVar2 != '\0') &&
         (((local_11 & 1) == 0 ||
          (pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)
                               &((HighsCDouble *)((long)in_RDI._M_current + 0x60))->lo,
                               (long)local_18),
          (double)((HighsCDouble *)((long)in_RDI._M_current + 0xb0))->hi < *pvVar3)))) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0,
                   (value_type_conflict2 *)in_stack_fffffffffffffeb8);
      }
    }
    sVar4 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)
                       &((HighsCDouble *)((long)in_RDI._M_current + 0x10))->lo);
    local_1c = (int)sVar4;
    local_24._M_current._4_4_ = 0;
    local_24._M_current._0_4_ = HighsRandom::integer((HighsRandom *)in_stack_fffffffffffffeb0);
    HighsCDouble::HighsCDouble(&local_38,0.0);
    _Var12._M_current = in_stack_fffffffffffffee0._8_8_;
    (((_Vector_base<int,_std::allocator<int>_> *)
     &((HighsCDouble *)((long)in_RDI._M_current + 0x30))->hi)->_M_impl).super__Vector_impl_data.
    _M_start = (pointer)local_38.hi;
    ((HighsCDouble *)((long)in_RDI._M_current + 0x30))->lo = local_38.lo;
    if ((local_11 & 1) == 0) {
      HighsLpRelaxation::getMipSolver
                ((HighsLpRelaxation *)
                 (((_Vector_base<int,_std::allocator<int>_> *)
                  &((HighsCDouble *)in_RDI._M_current)->hi)->_M_impl).super__Vector_impl_data.
                 _M_start);
      pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x58ab22);
      local_a0 = (HighsCDouble *)&pHVar7->nodequeue;
      local_b0 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea8);
      local_a8 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator+(in_stack_fffffffffffffeb8,
                                    (difference_type)in_stack_fffffffffffffeb0);
      local_c0 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea8);
      in_stack_fffffffffffffea8 = (HighsCDouble *)in_RDI._M_current;
      local_b8 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator+(in_stack_fffffffffffffeb8,
                                    (difference_type)in_stack_fffffffffffffeb0);
      local_d0 = local_a0;
      in_stack_fffffffffffffeb8 = &local_24;
      begin._M_current._4_4_ = in_stack_fffffffffffffef4;
      begin._M_current._0_4_ = in_stack_fffffffffffffef0;
      comp_00.nodequeue = (HighsNodeQueue *)in_stack_ffffffffffffff08;
      comp_00.this = (HighsCutGeneration *)in_stack_ffffffffffffff00;
      comp_00.r = in_stack_ffffffffffffff10;
      in_stack_fffffffffffffeb0 = local_a0;
      in_RDI._M_current = (int *)in_stack_fffffffffffffea8;
      local_c8 = in_stack_fffffffffffffeb8;
      pdqsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                (begin,_Var12,comp_00);
    }
    else {
      local_48 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea8);
      local_50 = (int *)std::vector<int,_std::allocator<int>_>::end
                                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea8);
      local_40 = (int *)std::
                        partition<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__0>
                                  (in_RDI,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      local_60 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea8);
      dVar5 = __gnu_cxx::operator-
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffeb0,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffea8);
      local_24._M_current._4_4_ = (int)dVar5;
      for (local_64 = 0; _Var12._M_current = in_stack_fffffffffffffee0._0_8_,
          local_64 != local_24._M_current._4_4_; local_64 = local_64 + 1) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI._M_current + 6),
                            (long)local_64);
        local_68 = *pvVar6;
        in_stack_fffffffffffffed0._M_current =
             *(int **)(*(long *)(in_RDI._M_current + 0x30) + (long)local_68 * 8);
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(in_RDI._M_current + 0x14),
                   (long)local_68);
        HighsCDouble::operator+=(in_stack_fffffffffffffec0,(double)in_stack_fffffffffffffeb8);
      }
      local_78 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea8);
      local_70 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator+(in_stack_fffffffffffffeb8,
                                    (difference_type)in_stack_fffffffffffffeb0);
      local_88 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea8);
      local_80 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator+(in_stack_fffffffffffffeb8,
                                    (difference_type)in_stack_fffffffffffffeb0);
      local_90 = &local_24;
      comp.r = in_stack_fffffffffffffed0._M_current;
      comp.this = in_stack_fffffffffffffec8.this;
      pdqsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                (_Var12,in_RDI,comp);
    }
    local_e8 = (double)((HighsCDouble *)((long)in_RDI._M_current + 0xb0))->hi * 10.0;
    __new_size = (pointer)((HighsCDouble *)((long)in_RDI._M_current + 0xb0))->hi;
    pHVar9 = (HighsCDouble *)((long)in_RDI._M_current + 0xd0);
    HighsCDouble::operator_cast_to_double(pHVar9);
    std::abs((int)pHVar9);
    pdVar8 = std::max<double>(&local_e8,(double *)&stack0xffffffffffffff10);
    local_e0 = *pdVar8;
    for (; local_24._M_current._4_4_ != local_1c;
        local_24._M_current._4_4_ = local_24._M_current._4_4_ + 1) {
      HVar11 = HighsCDouble::operator-(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      local_108 = HVar11.hi;
      dVar10 = HighsCDouble::operator_cast_to_double((HighsCDouble *)&local_108);
      if (local_e0 < dVar10) break;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &((HighsCDouble *)((long)in_RDI._M_current + 0x10))->lo,
                          (long)local_24._M_current._4_4_);
      pHVar9 = *(HighsCDouble **)
                ((((_Vector_base<int,_std::allocator<int>_> *)
                  &((HighsCDouble *)((long)in_RDI._M_current + 0xc0))->hi)->_M_impl).
                 super__Vector_impl_data._M_start + (long)*pvVar6 * 2);
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)((long)in_RDI._M_current + 0x50),
                 (long)*pvVar6);
      HighsCDouble::operator+=(pHVar9,(double)in_stack_fffffffffffffeb8);
    }
    if (local_24._M_current._4_4_ == 0) {
      local_1 = false;
    }
    else {
      HighsCDouble::renormalize((HighsCDouble *)0x58ad53);
      HVar11 = HighsCDouble::operator-(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      ((HighsCDouble *)((long)in_RDI._M_current + 0x40))->hi = (double)HVar11.hi;
      ((HighsCDouble *)((long)in_RDI._M_current + 0x40))->lo = HVar11.lo;
      bVar1 = HighsCDouble::operator<=(in_stack_fffffffffffffeb0,(double)in_stack_fffffffffffffea8);
      if (bVar1) {
        local_1 = false;
      }
      else {
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0._M_current,
                   (size_type)__new_size);
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

bool HighsCutGeneration::determineCover(bool lpSol) {
  if (rhs <= 10 * feastol) return false;

  cover.clear();
  cover.reserve(rowlen);

  for (HighsInt j = 0; j != rowlen; ++j) {
    if (!isintegral[j]) continue;

    if (lpSol && solval[j] <= feastol) continue;

    cover.push_back(j);
  }

  HighsInt maxCoverSize = cover.size();
  HighsInt coversize = 0;
  HighsInt r = randgen.integer();
  coverweight = 0.0;
  if (lpSol) {
    // take all variables that sit at their upper bound always into the cover
    coversize = std::partition(cover.begin(), cover.end(),
                               [&](HighsInt j) {
                                 return solval[j] >= upper[j] - feastol;
                               }) -
                cover.begin();

    for (HighsInt i = 0; i != coversize; ++i) {
      HighsInt j = cover[i];

      assert(solval[j] >= upper[j] - feastol);

      coverweight += vals[j] * upper[j];
    }

    // sort the remaining variables by the contribution to the rows activity in
    // the current solution
    pdqsort(cover.begin() + coversize, cover.begin() + maxCoverSize,
            [&](HighsInt i, HighsInt j) {
              if (upper[i] < 1.5 && upper[j] > 1.5) return true;
              if (upper[i] > 1.5 && upper[j] < 1.5) return false;

              double contributionA = solval[i] * vals[i];
              double contributionB = solval[j] * vals[j];

              if (contributionA > contributionB + feastol) return true;
              if (contributionA < contributionB - feastol) return false;
              // for equal contributions take the larger coefficients first
              // because this makes some of the lifting functions more likely
              // to generate a facet
              // if the value is equal too, choose a random tiebreaker based
              // on hashing the column index and the current number of pool
              // cuts
              if (std::abs(vals[i] - vals[j]) <= feastol)
                return HighsHashHelpers::hash(std::make_pair(inds[i], r)) >
                       HighsHashHelpers::hash(std::make_pair(inds[j], r));
              return vals[i] > vals[j];
            });
  } else {
    // the current solution
    const auto& nodequeue = lpRelaxation.getMipSolver().mipdata_->nodequeue;

    pdqsort(cover.begin() + coversize, cover.begin() + maxCoverSize,
            [&](HighsInt i, HighsInt j) {
              if (solval[i] > feastol && solval[j] <= feastol) return true;
              if (solval[i] <= feastol && solval[j] > feastol) return false;

              int64_t numNodesA;
              int64_t numNodesB;

              numNodesA = complementation[i] ? nodequeue.numNodesDown(inds[i])
                                             : nodequeue.numNodesUp(inds[i]);

              numNodesB = complementation[j] ? nodequeue.numNodesDown(inds[j])
                                             : nodequeue.numNodesUp(inds[j]);

              if (numNodesA > numNodesB) return true;
              if (numNodesA < numNodesB) return false;

              return HighsHashHelpers::hash(std::make_pair(inds[i], r)) >
                     HighsHashHelpers::hash(std::make_pair(inds[j], r));
            });
  }

  const double minlambda =
      std::max(10 * feastol, feastol * std::abs(double(rhs)));

  for (; coversize != maxCoverSize; ++coversize) {
    double lambda = double(coverweight - rhs);
    if (lambda > minlambda) break;

    HighsInt j = cover[coversize];
    coverweight += vals[j] * upper[j];
  }
  if (coversize == 0) return false;

  coverweight.renormalize();
  lambda = coverweight - rhs;

  if (lambda <= minlambda) return false;

  cover.resize(coversize);
  assert(lambda > feastol);

  return true;
}